

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_systemv.cpp
# Opt level: O3

void __thiscall
QSharedMemorySystemV::updateNativeKeyFile(QSharedMemorySystemV *this,QNativeIpcKey *nativeKey)

{
  QArrayData *pQVar1;
  long lVar2;
  QChar *data;
  qsizetype qVar3;
  QArrayData *data_00;
  char *pcVar4;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &((nativeKey->key).d.d)->super_QArrayData;
  lVar2 = (nativeKey->key).d.size;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (lVar2 != 0) {
    pQVar1 = &((nativeKey->key).d.d)->super_QArrayData;
    data = (QChar *)(nativeKey->key).d.ptr;
    qVar3 = (nativeKey->key).d.size;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::toLocal8Bit_helper(&local_38,data,qVar3);
    data_00 = &((this->nativeKeyFile).d.d)->super_QArrayData;
    pcVar4 = (this->nativeKeyFile).d.ptr;
    (this->nativeKeyFile).d.d = local_38.d.d;
    (this->nativeKeyFile).d.ptr = local_38.d.ptr;
    qVar3 = (this->nativeKeyFile).d.size;
    (this->nativeKeyFile).d.size = local_38.d.size;
    local_38.d.d = (Data *)data_00;
    local_38.d.ptr = pcVar4;
    local_38.d.size = qVar3;
    if (data_00 != (QArrayData *)0x0) {
      LOCK();
      (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
           (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data_00,1,0x10);
      }
    }
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QSharedMemorySystemV::updateNativeKeyFile(const QNativeIpcKey &nativeKey)
{
    Q_ASSERT(nativeKeyFile.isEmpty() );
    if (!nativeKey.nativeKey().isEmpty())
        nativeKeyFile = QFile::encodeName(nativeKey.nativeKey());
}